

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::AddDescriptorKey
          (DescriptorScriptPubKeyMan *this,CKey *key,CPubKey *pubkey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_91;
  WalletBatch local_90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  WalletDatabase *pWVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock61,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x903,false);
  iVar2 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_90,pWVar3,1);
  local_90.m_database = pWVar3;
  bVar1 = AddDescriptorKeyWithDB(this,&local_90,key,pubkey);
  if (bVar1) {
    if (local_90.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
      (**(code **)(*(long *)local_90.m_batch._M_t.
                            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl +
                  0x28))();
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock61.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"AddDescriptorKey",&local_91);
    std::operator+(&local_50,&local_70,": writing descriptor private key failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::AddDescriptorKey(const CKey& key, const CPubKey &pubkey)
{
    LOCK(cs_desc_man);
    WalletBatch batch(m_storage.GetDatabase());
    if (!AddDescriptorKeyWithDB(batch, key, pubkey)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor private key failed");
    }
}